

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

run_container_t * run_container_from_array(array_container_t *c)

{
  int iVar1;
  uint16_t *puVar2;
  rle16_t *prVar3;
  uint uVar4;
  run_container_t *prVar5;
  ushort uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  int32_t size;
  uint uVar10;
  ulong uVar11;
  
  if ((long)c->cardinality == 0) {
    size = 0;
  }
  else {
    lVar8 = 0;
    uVar10 = 0xfffffffe;
    size = 0;
    do {
      uVar9 = uVar10 + 1;
      uVar10 = (uint)*(ushort *)((long)c->array + lVar8);
      size = size + (uint)(uVar9 != uVar10);
      lVar8 = lVar8 + 2;
    } while ((long)c->cardinality * 2 != lVar8);
  }
  prVar5 = run_container_create_given_capacity(size);
  uVar10 = c->cardinality;
  if ((ulong)uVar10 != 0) {
    if ((int)uVar10 < 1) {
      uVar6 = 0xfffe;
      uVar9 = 0xffffffff;
    }
    else {
      puVar2 = c->array;
      uVar9 = 0xffffffff;
      uVar7 = 0xfffffffe;
      uVar11 = 0;
      do {
        uVar6 = puVar2[uVar11];
        uVar4 = uVar9;
        if ((uVar7 + 1 != (uint)uVar6) && (uVar4 = (uint)uVar6, uVar9 != 0xffffffff)) {
          prVar3 = prVar5->runs;
          iVar1 = prVar5->n_runs;
          prVar3[iVar1].value = (uint16_t)uVar9;
          prVar3[iVar1].length = (short)uVar7 - (uint16_t)uVar9;
          prVar5->n_runs = iVar1 + 1;
        }
        uVar9 = uVar4;
        uVar6 = puVar2[uVar11];
        uVar7 = (uint)uVar6;
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    prVar3 = prVar5->runs;
    iVar1 = prVar5->n_runs;
    prVar3[iVar1].value = (uint16_t)uVar9;
    prVar3[iVar1].length = uVar6 - (uint16_t)uVar9;
    prVar5->n_runs = iVar1 + 1;
  }
  return prVar5;
}

Assistant:

run_container_t *run_container_from_array(const array_container_t *c) {
    int32_t n_runs = array_container_number_of_runs(c);
    run_container_t *answer = run_container_create_given_capacity(n_runs);
    int prev = -2;
    int run_start = -1;
    int32_t card = c->cardinality;
    if (card == 0) return answer;
    for (int i = 0; i < card; ++i) {
        const uint16_t cur_val = c->array[i];
        if (cur_val != prev + 1) {
            // new run starts; flush old one, if any
            if (run_start != -1) add_run(answer, run_start, prev);
            run_start = cur_val;
        }
        prev = c->array[i];
    }
    // now prev is the last seen value
    add_run(answer, run_start, prev);
    // assert(run_container_cardinality(answer) == c->cardinality);
    return answer;
}